

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cpp
# Opt level: O1

void StoreSymbolWithContext
               (BlockEncoder *self,size_t symbol,size_t context,uint32_t *context_map,
               size_t *storage_ix,uint8_t *storage,size_t context_bits)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar8;
  ulong uVar9;
  long lVar7;
  
  if (self->block_len_ == 0) {
    sVar5 = self->block_ix_;
    self->block_ix_ = sVar5 + 1;
    uVar4 = self->block_lengths_[sVar5 + 1];
    uVar6 = (ulong)self->block_types_[sVar5 + 1];
    self->block_len_ = (ulong)uVar4;
    self->entropy_ix_ = uVar6 << ((byte)context_bits & 0x3f);
    sVar5 = (self->block_split_code_).type_code_calculator.last_type;
    lVar8 = 1;
    if (sVar5 + 1 != uVar6) {
      lVar8 = 0;
      if ((self->block_split_code_).type_code_calculator.second_last_type != uVar6) {
        lVar8 = uVar6 + 2;
      }
    }
    (self->block_split_code_).type_code_calculator.second_last_type = sVar5;
    (self->block_split_code_).type_code_calculator.last_type = uVar6;
    uVar6 = *storage_ix;
    uVar9 = (self->block_split_code_).type_depths[lVar8] + uVar6;
    *(ulong *)(storage + (uVar6 >> 3)) =
         (ulong)(self->block_split_code_).type_bits[lVar8] << ((byte)uVar6 & 7) |
         (ulong)storage[uVar6 >> 3];
    *storage_ix = uVar9;
    lVar8 = 0xe;
    if (0x2f0 < uVar4) {
      lVar8 = 0x14;
    }
    lVar7 = 7;
    if (uVar4 < 0x29) {
      lVar7 = 0;
    }
    if (0xb0 < uVar4) {
      lVar7 = lVar8;
    }
    uVar6 = lVar7 - 1;
    do {
      if (uVar6 == 0x18) {
        uVar6 = 0x19;
        break;
      }
      lVar8 = uVar6 * 4;
      uVar6 = uVar6 + 1;
    } while (*(ushort *)(duckdb_brotli::_kBrotliPrefixCodeRanges + lVar8 + 8) <= uVar4);
    uVar6 = uVar6 & 0xffffffff;
    bVar1 = duckdb_brotli::_kBrotliPrefixCodeRanges[uVar6 * 4 + 2];
    uVar3 = *(ushort *)(duckdb_brotli::_kBrotliPrefixCodeRanges + uVar6 * 4);
    bVar2 = (self->block_split_code_).length_depths[uVar6];
    *(ulong *)(storage + (uVar9 >> 3)) =
         (ulong)(self->block_split_code_).length_bits[uVar6] << ((byte)uVar9 & 7) |
         (ulong)storage[uVar9 >> 3];
    uVar9 = bVar2 + uVar9;
    *storage_ix = uVar9;
    *(ulong *)(storage + (uVar9 >> 3)) =
         (ulong)(uVar4 - uVar3) << ((byte)uVar9 & 7) | (ulong)storage[uVar9 >> 3];
    *storage_ix = uVar9 + bVar1;
  }
  self->block_len_ = self->block_len_ - 1;
  lVar8 = (ulong)context_map[self->entropy_ix_ + context] * self->histogram_length_ + symbol;
  bVar1 = self->depths_[lVar8];
  uVar6 = *storage_ix;
  *(ulong *)(storage + (uVar6 >> 3)) =
       (ulong)self->bits_[lVar8] << ((byte)uVar6 & 7) | (ulong)storage[uVar6 >> 3];
  *storage_ix = bVar1 + uVar6;
  return;
}

Assistant:

static void StoreSymbolWithContext(BlockEncoder* self, size_t symbol,
    size_t context, const uint32_t* context_map, size_t* storage_ix,
    uint8_t* storage, const size_t context_bits) {
  if (self->block_len_ == 0) {
    size_t block_ix = ++self->block_ix_;
    uint32_t block_len = self->block_lengths_[block_ix];
    uint8_t block_type = self->block_types_[block_ix];
    self->block_len_ = block_len;
    self->entropy_ix_ = (size_t)block_type << context_bits;
    StoreBlockSwitch(&self->block_split_code_, block_len, block_type, 0,
        storage_ix, storage);
  }
  --self->block_len_;
  {
    size_t histo_ix = context_map[self->entropy_ix_ + context];
    size_t ix = histo_ix * self->histogram_length_ + symbol;
    BrotliWriteBits(self->depths_[ix], self->bits_[ix], storage_ix, storage);
  }
}